

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_elements_transaction.cpp
# Opt level: O1

uint32_t __thiscall
cfd::ConfidentialTransactionController::GetSizeIgnoreTxIn
          (ConfidentialTransactionController *this,bool is_blinded,uint32_t *witness_area_size,
          uint32_t *no_witness_area_size,int exponent,int minimum_bits)

{
  bool bVar1;
  undefined7 in_register_00000031;
  ConfidentialTxOutReference *txout;
  pointer pCVar2;
  pointer this_00;
  int iVar3;
  uint32_t input_asset_count;
  int iVar4;
  uint32_t temp_no_witness_size;
  undefined4 local_94;
  int local_90;
  int local_8c;
  uint32_t temp_witness_size;
  undefined4 uStack_84;
  uint32_t *local_70;
  uint32_t *local_68;
  vector<cfd::core::ConfidentialTxInReference,_std::allocator<cfd::core::ConfidentialTxInReference>_>
  txins;
  vector<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
  txouts;
  
  local_94 = (undefined4)CONCAT71(in_register_00000031,is_blinded);
  local_90 = exponent;
  local_8c = minimum_bits;
  local_70 = witness_area_size;
  local_68 = no_witness_area_size;
  core::ConfidentialTransaction::GetTxOutList(&txouts,&this->transaction_);
  core::ConfidentialTransaction::GetTxInList(&txins,&this->transaction_);
  iVar4 = 0;
  input_asset_count = 0;
  if (txins.
      super__Vector_base<cfd::core::ConfidentialTxInReference,_std::allocator<cfd::core::ConfidentialTxInReference>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      txins.
      super__Vector_base<cfd::core::ConfidentialTxInReference,_std::allocator<cfd::core::ConfidentialTxInReference>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    input_asset_count = 0;
    pCVar2 = txins.
             super__Vector_base<cfd::core::ConfidentialTxInReference,_std::allocator<cfd::core::ConfidentialTxInReference>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&temp_witness_size,
                 &(pCVar2->asset_entropy_).data_);
      bVar1 = core::ByteData256::IsEmpty((ByteData256 *)&temp_witness_size);
      if ((void *)CONCAT44(uStack_84,temp_witness_size) != (void *)0x0) {
        operator_delete((void *)CONCAT44(uStack_84,temp_witness_size));
      }
      if (!bVar1) {
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&temp_witness_size,
                   &(pCVar2->blinding_nonce_).data_);
        bVar1 = core::ByteData256::IsEmpty((ByteData256 *)&temp_witness_size);
        if ((void *)CONCAT44(uStack_84,temp_witness_size) != (void *)0x0) {
          operator_delete((void *)CONCAT44(uStack_84,temp_witness_size));
        }
        input_asset_count = input_asset_count + bVar1 + 1;
      }
      input_asset_count = input_asset_count + 1;
      pCVar2 = pCVar2 + 1;
    } while (pCVar2 != txins.
                       super__Vector_base<cfd::core::ConfidentialTxInReference,_std::allocator<cfd::core::ConfidentialTxInReference>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  }
  temp_witness_size = 0;
  temp_no_witness_size = 0;
  if (txouts.
      super__Vector_base<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      txouts.
      super__Vector_base<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    iVar3 = 0xb;
  }
  else {
    iVar3 = 0;
    bVar1 = local_94._0_1_;
    iVar4 = 0;
    this_00 = txouts.
              super__Vector_base<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      core::ConfidentialTxOutReference::GetSerializeSize
                (this_00,bVar1,&temp_witness_size,&temp_no_witness_size,local_90,local_8c,
                 (uint32_t *)0x0,input_asset_count);
      iVar4 = iVar4 + temp_witness_size;
      iVar3 = iVar3 + temp_no_witness_size;
      this_00 = this_00 + 1;
    } while (this_00 !=
             txouts.
             super__Vector_base<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
             ._M_impl.super__Vector_impl_data._M_finish);
    iVar3 = iVar3 + 0xb;
  }
  if (local_70 != (uint32_t *)0x0) {
    *local_70 = *local_70 + iVar4;
  }
  if (local_68 != (uint32_t *)0x0) {
    *local_68 = *local_68 + iVar3;
  }
  std::
  vector<cfd::core::ConfidentialTxInReference,_std::allocator<cfd::core::ConfidentialTxInReference>_>
  ::~vector(&txins);
  std::
  vector<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
  ::~vector(&txouts);
  return iVar3 + iVar4;
}

Assistant:

uint32_t ConfidentialTransactionController::GetSizeIgnoreTxIn(
    bool is_blinded, uint32_t* witness_area_size,
    uint32_t* no_witness_area_size, int exponent, int minimum_bits) const {
  uint32_t size = ConfidentialTransaction::kElementsTransactionMinimumSize;
  std::vector<ConfidentialTxOutReference> txouts = transaction_.GetTxOutList();
  std::vector<ConfidentialTxInReference> txins = transaction_.GetTxInList();

  uint32_t temp_asset_count = 0;

  // search vin from issue/reissue
  for (const auto& txin : txins) {
    if (!txin.GetAssetEntropy().IsEmpty()) {
      ++temp_asset_count;
      if (!txin.GetBlindingNonce().IsEmpty()) {
        // reissuance
      } else {
        ++temp_asset_count;  // issuance
      }
    }
    ++temp_asset_count;
  }

  uint32_t witness_size = 0;
  uint32_t no_witness_size = 0;
  uint32_t temp_witness_size = 0;
  uint32_t temp_no_witness_size = 0;
  for (const auto& txout : txouts) {
    txout.GetSerializeSize(
        is_blinded, &temp_witness_size, &temp_no_witness_size, exponent,
        minimum_bits, nullptr, temp_asset_count);
    witness_size += temp_witness_size;
    no_witness_size += temp_no_witness_size;
  }
  size += no_witness_size;

  if (witness_area_size != nullptr) {
    *witness_area_size += witness_size;
  }
  if (no_witness_area_size != nullptr) {
    *no_witness_area_size += size;
  }
  return size + witness_size;
}